

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::OutputTypes::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  OutputTypes *this_local;
  
  local_18 = this;
  this_local = (OutputTypes *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                   \nout vec3 a[2];                 \nout uint b;                    \nout float c[2];                \nout int d[2];                  \nout vec2 e;                    \nvoid main() {                  \n    c[1] = -0.6;               \n    d[0] = 0;                  \n    b = 12u;                   \n    c[0] = 1.1;                \n    e = vec2(0, 1);            \n    d[1] = -19;                \n    a[1] = vec3(0, 1, 0);      \n    a[0] = vec3(0, 1, 0);      \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 430                   \n"
			   "out vec3 a[2];                 \n"
			   "out uint b;                    \n"
			   "out float c[2];                \n"
			   "out int d[2];                  \n"
			   "out vec2 e;                    \n"
			   "void main() {                  \n"
			   "    c[1] = -0.6;               \n"
			   "    d[0] = 0;                  \n"
			   "    b = 12u;                   \n"
			   "    c[0] = 1.1;                \n"
			   "    e = vec2(0, 1);            \n"
			   "    d[1] = -19;                \n"
			   "    a[1] = vec3(0, 1, 0);      \n"
			   "    a[0] = vec3(0, 1, 0);      \n"
			   "}";
	}